

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

nghttp2_ssize
nghttp2_session_mem_send_internal(nghttp2_session *session,uint8_t **data_ptr,int fast_cb)

{
  nghttp2_mem *mem;
  nghttp2_active_outbound_item *aob;
  nghttp2_bufs *bufs;
  nghttp2_hd_deflater *deflater;
  uint uVar1;
  nghttp2_map_key_type key;
  nghttp2_outbound_item *pnVar2;
  nghttp2_buf_chain *pnVar3;
  uint8_t *puVar4;
  nghttp2_before_frame_send_callback p_Var5;
  nghttp2_on_frame_not_send_callback p_Var6;
  int iVar7;
  int iVar8;
  uint uVar9;
  nghttp2_frame *pnVar10;
  nghttp2_stream *pnVar11;
  nghttp2_pack_extension_callback2 p_Var12;
  ulong uVar13;
  size_t sVar14;
  long lVar15;
  void *pvVar16;
  uint8_t uVar17;
  char cVar18;
  uint uVar19;
  uint32_t uVar20;
  nghttp2_frame *frame;
  nghttp2_ssize unaff_RBP;
  int32_t stream_id;
  uint8_t *puVar21;
  ulong uVar22;
  bool bVar23;
  
  iVar7 = nghttp2_session_adjust_idle_stream(session);
  if (iVar7 < -900) {
    unaff_RBP = (nghttp2_ssize)iVar7;
  }
  else {
    mem = &session->mem;
    aob = &session->aob;
    bufs = &(session->aob).framebufs;
    deflater = &session->hd_deflater;
LAB_0010b28d:
    do {
code_r0x0010b29b:
      switch((session->aob).state) {
      case NGHTTP2_OB_POP_ITEM:
        pnVar10 = &nghttp2_session_pop_next_ob_item(session)->frame;
        cVar18 = '\x01';
        if (pnVar10 == (nghttp2_frame *)0x0) {
          unaff_RBP = 0;
        }
        else {
          uVar17 = (pnVar10->hd).type;
          switch(uVar17) {
          case '\0':
            pnVar11 = (nghttp2_stream *)nghttp2_map_find(&session->streams,(pnVar10->hd).stream_id);
            if ((pnVar11 == (nghttp2_stream *)0x0) || ((pnVar11->flags & 2) != 0)) {
              pnVar11 = (nghttp2_stream *)0x0;
            }
            else if (pnVar11->state == NGHTTP2_STREAM_IDLE) {
              pnVar11 = (nghttp2_stream *)0x0;
            }
            if ((pnVar11 != (nghttp2_stream *)0x0) && (&pnVar11->item->frame != pnVar10)) {
              __assert_fail("stream->item == item",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                            ,0x923,
                            "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
            }
            uVar9 = nghttp2_session_predicate_data_send(session,pnVar11);
            if (uVar9 == 0) {
              if (pnVar11 == (nghttp2_stream *)0x0) {
                __assert_fail("stream",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                              ,0x933,
                              "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
              }
              uVar9 = session->remote_window_size;
              uVar1 = (session->remote_settings).max_frame_size;
              uVar19 = pnVar11->remote_window_size;
              if ((int)uVar9 <= pnVar11->remote_window_size) {
                uVar19 = uVar9;
              }
              if ((int)uVar1 <= (int)uVar19) {
                uVar19 = uVar1;
              }
              if ((int)uVar19 < 1) {
                if ((int)uVar9 < 1) {
                  __assert_fail("session->remote_window_size > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                                ,0x939,
                                "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)"
                               );
                }
                uVar17 = '\x04';
LAB_0010bd48:
                session_defer_stream_item(session,pnVar11,uVar17);
                (session->aob).item = (nghttp2_outbound_item *)0x0;
                active_outbound_item_reset(aob,mem);
                uVar9 = 0xfffffe04;
              }
              else {
                if (0x3fff < (int)uVar19) {
                  uVar19 = 0x4000;
                }
                uVar9 = nghttp2_session_pack_data
                                  (session,bufs,(ulong)uVar19,pnVar10,
                                   (nghttp2_data_aux_data *)((long)pnVar10 + 0x60),pnVar11);
                if ((int)uVar9 < -0x1fc) {
                  if (uVar9 != 0xfffffdf2) {
                    if (uVar9 == 0xfffffdf7) {
                      session_detach_stream_item(session,pnVar11);
                      uVar9 = nghttp2_session_add_rst_stream(session,(pnVar10->hd).stream_id,2);
                      if (-0x385 < (int)uVar9) {
                        uVar9 = 0xfffffdf7;
                      }
                    }
                    else {
LAB_0010b776:
                      session_detach_stream_item(session,pnVar11);
                    }
                  }
                }
                else if (uVar9 != 0) {
                  if (uVar9 != 0xfffffe04) goto LAB_0010b776;
                  uVar17 = '\b';
                  goto LAB_0010bd48;
                }
              }
            }
            else {
              pnVar11 = (nghttp2_stream *)
                        nghttp2_map_find(&session->streams,(pnVar10->hd).stream_id);
              if (pnVar11 != (nghttp2_stream *)0x0) goto LAB_0010b776;
            }
            break;
          case '\x01':
            if ((pnVar10->headers).cat == NGHTTP2_HCAT_REQUEST) {
              bVar23 = false;
              pnVar11 = nghttp2_session_open_stream
                                  (session,(pnVar10->hd).stream_id,'\0',&(pnVar10->headers).pri_spec
                                   ,NGHTTP2_STREAM_INITIAL,*(void **)((long)pnVar10 + 0x78));
              if (pnVar11 == (nghttp2_stream *)0x0) {
                uVar9 = 0xfffffc7b;
              }
              else {
                uVar9 = 0xfffffe01;
                if ((*(char *)((long)pnVar10 + 0x84) == '\0') &&
                   (uVar9 = 0xfffffdfc, (session->goaway_flags & 8) == 0)) {
                  uVar9 = session_is_closing(session);
                  if (uVar9 != 0) {
                    uVar9 = 0xfffffdfc;
                  }
                }
                if (uVar9 == 0) {
                  bVar23 = true;
                  if ((session->opt_flags & 4) == 0) {
                    nghttp2_http_record_request_method(pnVar11,pnVar10);
                  }
                }
                else {
                  bVar23 = false;
                }
              }
              if (bVar23) goto LAB_0010bd8a;
            }
            else {
              pvVar16 = nghttp2_map_find(&session->streams,(pnVar10->hd).stream_id);
              if ((pvVar16 == (void *)0x0) || ((*(byte *)((long)pvVar16 + 0xd8) & 2) != 0)) {
                pvVar16 = (void *)0x0;
              }
              else if (*(int *)((long)pvVar16 + 0xcc) == 5) {
                pvVar16 = (void *)0x0;
              }
              if (pvVar16 == (void *)0x0) {
                (pnVar10->headers).cat = NGHTTP2_HCAT_HEADERS;
                uVar9 = 0xfffffe02;
LAB_0010bc74:
                if (uVar9 == 0) {
                  if (pvVar16 == (void *)0x0) {
                    __assert_fail("stream",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                                  ,0x7a4,
                                  "int session_predicate_headers_send(nghttp2_session *, nghttp2_stream *)"
                                 );
                  }
                  if (*(int *)((long)pvVar16 + 0xcc) == 2) goto LAB_0010c1d6;
                  if (*(int *)((long)pvVar16 + 0xcc) == 3) {
                    uVar9 = 0xfffffe01;
                  }
                  else if (*(int *)((long)pvVar16 + 0xa8) == 0) {
                    uVar9 = 0xfffffdfe;
                  }
                  else {
                    uVar9 = 0;
                    if (((session->server == '\0' ^ (byte)*(int *)((long)pvVar16 + 0xa8)) & 1) != 0)
                    {
                      uVar9 = 0xfffffdfe;
                    }
                  }
                }
              }
              else {
                iVar7 = *(int *)((long)pvVar16 + 0xcc);
                iVar8 = session_is_closing(session);
                if (iVar7 == 4) {
                  uVar9 = 0xfffffdee;
                  if (iVar8 == 0) {
                    uVar9 = (uint)((*(byte *)((long)pvVar16 + 0xd9) & 2) == 0) * 0x200 - 0x200;
                  }
                  if (((uVar9 == 0) && (uVar9 = 0xfffffe07, session->server != '\0')) &&
                     ((*(int *)((long)pvVar16 + 0xcc) == 4 &&
                      (uVar9 = 0xfffffdfc, (session->goaway_flags & 8) == 0)))) {
                    uVar9 = 0;
                  }
                  if (uVar9 == 0) {
                    (pnVar10->headers).cat = NGHTTP2_HCAT_PUSH_RESPONSE;
                    uVar9 = 0;
                    if (*(long *)((long)pnVar10 + 0x78) != 0) {
                      *(long *)((long)pvVar16 + 0x90) = *(long *)((long)pnVar10 + 0x78);
                    }
                  }
                }
                else {
                  if ((((iVar8 != 0) || ((*(byte *)((long)pvVar16 + 0xd9) & 2) != 0)) ||
                      (session->server == '\0')) ||
                     ((*(uint *)((long)pvVar16 + 0xa8) != 0 &&
                       (*(uint *)((long)pvVar16 + 0xa8) & 1) == 0 ||
                      (*(int *)((long)pvVar16 + 0xcc) != 1)))) {
                    (pnVar10->headers).cat = NGHTTP2_HCAT_HEADERS;
                    iVar7 = session_is_closing(session);
                    uVar9 = 0xfffffdee;
                    if (iVar7 == 0) {
                      uVar9 = (uint)((*(byte *)((long)pvVar16 + 0xd9) & 2) == 0) * 0x200 - 0x200;
                    }
                    goto LAB_0010bc74;
                  }
                  (pnVar10->headers).cat = NGHTTP2_HCAT_RESPONSE;
LAB_0010c1d6:
                  uVar9 = 0;
                }
              }
              if (uVar9 == 0) {
LAB_0010bd8a:
                sVar14 = nghttp2_hd_deflate_bound
                                   (deflater,(pnVar10->headers).nva,(pnVar10->headers).nvlen);
                uVar9 = 0xfffffdf6;
                if (((sVar14 + 5 <= session->max_send_header_block_length) &&
                    (uVar9 = nghttp2_frame_pack_headers(bufs,&pnVar10->headers,deflater), uVar9 == 0
                    )) && (uVar9 = session_headers_add_pad(session,pnVar10), uVar9 == 0)) {
                  uVar9 = 0;
                  if ((pnVar10->headers).cat == NGHTTP2_HCAT_REQUEST) {
                    if ((pnVar10->hd).stream_id <= session->last_sent_stream_id) {
                      __assert_fail("session->last_sent_stream_id < frame->hd.stream_id",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                                    ,0x9b9,
                                    "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)"
                                   );
                    }
                    session->last_sent_stream_id = (pnVar10->hd).stream_id;
                    uVar9 = 0;
                  }
                }
              }
            }
            break;
          case '\x02':
            iVar7 = session_is_closing(session);
            uVar9 = 0xfffffdee;
            if (iVar7 == 0) {
              nghttp2_frame_pack_priority(bufs,&pnVar10->priority);
LAB_0010b870:
              uVar9 = 0;
            }
            break;
          case '\x03':
            iVar7 = session_is_closing(session);
            uVar9 = 0xfffffdee;
            if (iVar7 == 0) {
              nghttp2_frame_pack_rst_stream(bufs,&pnVar10->rst_stream);
              goto LAB_0010b870;
            }
            break;
          case '\x04':
            if (((pnVar10->hd).flags & 1) != 0) {
              if (session->obq_flood_counter_ == 0) {
                __assert_fail("session->obq_flood_counter_ > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                              ,0x9d5,
                              "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
              }
              session->obq_flood_counter_ = session->obq_flood_counter_ - 1;
              iVar7 = session_is_closing(session);
              uVar9 = 0xfffffdee;
              if (iVar7 != 0) break;
            }
            uVar9 = nghttp2_frame_pack_settings(bufs,&pnVar10->settings);
            break;
          case '\x05':
            pvVar16 = nghttp2_map_find(&session->streams,(pnVar10->hd).stream_id);
            if ((pvVar16 == (void *)0x0) || ((*(byte *)((long)pvVar16 + 0xd8) & 2) != 0)) {
              pvVar16 = (void *)0x0;
            }
            else if (*(int *)((long)pvVar16 + 0xcc) == 5) {
              pvVar16 = (void *)0x0;
            }
            if (session->server == '\0') {
              uVar9 = 0xfffffe07;
            }
            else {
              if (pvVar16 == (void *)0x0) {
                uVar9 = 0xfffffe02;
              }
              else {
                iVar7 = session_is_closing(session);
                uVar9 = 0xfffffdee;
                if (iVar7 == 0) {
                  uVar9 = (uint)((*(byte *)((long)pvVar16 + 0xd9) & 2) == 0) * 0x200 - 0x200;
                }
              }
              if (uVar9 == 0) {
                if (pvVar16 == (void *)0x0) {
                  __assert_fail("stream",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                                ,0x7d9,
                                "int session_predicate_push_promise_send(nghttp2_session *, nghttp2_stream *)"
                               );
                }
                if ((session->remote_settings).enable_push == 0) {
                  uVar9 = 0xfffffdf0;
                }
                else {
                  uVar9 = 0xfffffe01;
                  if ((*(int *)((long)pvVar16 + 0xcc) != 3) &&
                     (uVar9 = 0xfffffdfc, (session->goaway_flags & 8) == 0)) {
                    uVar9 = 0;
                  }
                }
              }
            }
            if (uVar9 == 0) {
              if (pvVar16 == (void *)0x0) {
                __assert_fail("stream",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                              ,0x9f4,
                              "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
              }
              sVar14 = nghttp2_hd_deflate_bound
                                 (deflater,(pnVar10->push_promise).nva,(pnVar10->push_promise).nvlen
                                 );
              uVar9 = 0xfffffdf6;
              if (((sVar14 <= session->max_send_header_block_length) &&
                  (uVar9 = nghttp2_frame_pack_push_promise(bufs,&pnVar10->push_promise,deflater),
                  uVar9 == 0)) && (uVar9 = session_headers_add_pad(session,pnVar10), uVar9 == 0)) {
                if ((pnVar10->push_promise).promised_stream_id < session->last_sent_stream_id + 2) {
                  __assert_fail("session->last_sent_stream_id + 2 <= frame->push_promise.promised_stream_id"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                                ,0xa08,
                                "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)"
                               );
                }
                session->last_sent_stream_id = (pnVar10->push_promise).promised_stream_id;
                goto LAB_0010b870;
              }
            }
            break;
          case '\x06':
            if (((pnVar10->hd).flags & 1) != 0) {
              if (session->obq_flood_counter_ == 0) {
                __assert_fail("session->obq_flood_counter_ > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                              ,0xa0f,
                              "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
              }
              session->obq_flood_counter_ = session->obq_flood_counter_ - 1;
            }
            uVar9 = 0xfffffdee;
            if ((session->goaway_flags & 1) == 0) {
              nghttp2_frame_pack_ping(bufs,&pnVar10->ping);
              goto LAB_0010b870;
            }
            break;
          case '\a':
            uVar9 = nghttp2_frame_pack_goaway(bufs,&pnVar10->goaway);
            if (uVar9 == 0) {
              session->local_last_stream_id = (pnVar10->priority).pri_spec.stream_id;
              goto LAB_0010b870;
            }
            break;
          case '\b':
            iVar7 = (pnVar10->hd).stream_id;
            iVar8 = session_is_closing(session);
            uVar9 = 0xfffffdee;
            if ((iVar8 == 0) && (uVar9 = 0, iVar7 != 0)) {
              pvVar16 = nghttp2_map_find(&session->streams,iVar7);
              if ((pvVar16 == (void *)0x0) || ((*(byte *)((long)pvVar16 + 0xd8) & 2) != 0)) {
                pvVar16 = (void *)0x0;
              }
              else if (*(int *)((long)pvVar16 + 0xcc) == 5) {
                pvVar16 = (void *)0x0;
              }
              if (pvVar16 == (void *)0x0) {
                uVar9 = 0xfffffe02;
              }
              else if (*(int *)((long)pvVar16 + 0xcc) == 3) {
                uVar9 = 0xfffffe01;
              }
              else if (((*(int *)((long)pvVar16 + 0xcc) == 4) &&
                       (*(int *)((long)pvVar16 + 0xa8) != 0)) &&
                      (uVar9 = 0xfffffdfe,
                      ((session->server == '\0' ^ (byte)*(int *)((long)pvVar16 + 0xa8)) & 1) != 0))
              {
                uVar9 = 0;
              }
            }
            if (uVar9 == 0) {
              nghttp2_frame_pack_window_update(bufs,&pnVar10->window_update);
              goto LAB_0010b870;
            }
            break;
          case '\t':
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                          ,0xa2b,
                          "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
          default:
            if (*(char *)((long)pnVar10 + 0x60) == '\0') {
              iVar7 = session_is_closing(session);
              uVar9 = 0xfffffdee;
              if (iVar7 == 0) {
                p_Var12 = (session->callbacks).pack_extension_callback2;
                if ((p_Var12 == (nghttp2_pack_extension_callback2)0x0) &&
                   ((session->callbacks).pack_extension_callback ==
                    (nghttp2_pack_extension_callback)0x0)) {
                  __assert_fail("session->callbacks.pack_extension_callback2 || session->callbacks.pack_extension_callback"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                                ,0x8eb,
                                "int session_pack_extension(nghttp2_session *, nghttp2_bufs *, nghttp2_frame *)"
                               );
                }
                pnVar3 = bufs->head;
                puVar21 = (pnVar3->buf).last;
                uVar22 = (long)(pnVar3->buf).end - (long)puVar21;
                if (0x3fff < uVar22) {
                  uVar22 = 0x4000;
                }
                if (p_Var12 == (nghttp2_pack_extension_callback2)0x0) {
                  p_Var12 = (nghttp2_pack_extension_callback2)
                            (session->callbacks).pack_extension_callback;
                }
                uVar13 = (*p_Var12)(session,puVar21,uVar22,pnVar10,session->user_data);
                uVar9 = 0xfffffde9;
                if ((uVar13 != 0xfffffffffffffde9) && (uVar9 = 0xfffffc7a, uVar13 <= uVar22)) {
                  (pnVar10->hd).length = uVar13;
                  puVar21 = (pnVar3->buf).pos;
                  puVar4 = (pnVar3->buf).last;
                  if (puVar21 != puVar4) {
                    __assert_fail("buf->pos == buf->last",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                                  ,0x903,
                                  "int session_pack_extension(nghttp2_session *, nghttp2_bufs *, nghttp2_frame *)"
                                 );
                  }
                  (pnVar3->buf).last = puVar4 + uVar13;
                  puVar21 = puVar21 + -9;
                  (pnVar3->buf).pos = puVar21;
                  nghttp2_frame_pack_frame_hd(puVar21,&pnVar10->hd);
                  goto LAB_0010b870;
                }
              }
            }
            else if (uVar17 == '\x10') {
              key = *(pnVar10->ext).payload;
              iVar7 = session_is_closing(session);
              uVar9 = 0xfffffdee;
              if (iVar7 == 0) {
                pvVar16 = nghttp2_map_find(&session->streams,key);
                if ((pvVar16 == (void *)0x0) || ((*(byte *)((long)pvVar16 + 0xd8) & 2) != 0)) {
                  pvVar16 = (void *)0x0;
                }
                else if (*(int *)((long)pvVar16 + 0xcc) == 5) {
                  pvVar16 = (void *)0x0;
                }
                if (pvVar16 == (void *)0x0) {
                  uVar9 = 0;
                }
                else {
                  uVar9 = 0xfffffe01;
                  if ((*(int *)((long)pvVar16 + 0xcc) != 3) &&
                     (uVar9 = 0xfffffdfe, (*(byte *)((long)pvVar16 + 0xd9) & 1) == 0)) {
                    uVar9 = 0;
                  }
                }
              }
              if (uVar9 == 0) {
                nghttp2_frame_pack_priority_update(bufs,&pnVar10->ext);
                goto LAB_0010b870;
              }
            }
            else if (uVar17 == '\f') {
              iVar7 = session_is_closing(session);
              uVar9 = 0xfffffdee;
              if (iVar7 == 0) {
                uVar9 = nghttp2_frame_pack_origin(bufs,&pnVar10->ext);
              }
            }
            else {
              if (uVar17 != '\n') {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                              ,0xa60,
                              "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
              }
              iVar7 = (pnVar10->hd).stream_id;
              iVar8 = session_is_closing(session);
              uVar9 = 0xfffffdee;
              if (iVar8 == 0) {
                if (iVar7 == 0) {
                  uVar9 = 0;
                }
                else {
                  pvVar16 = nghttp2_map_find(&session->streams,iVar7);
                  if ((pvVar16 == (void *)0x0) || ((*(byte *)((long)pvVar16 + 0xd8) & 2) != 0)) {
                    pvVar16 = (void *)0x0;
                  }
                  else if (*(int *)((long)pvVar16 + 0xcc) == 5) {
                    pvVar16 = (void *)0x0;
                  }
                  if (pvVar16 == (void *)0x0) {
                    uVar9 = 0xfffffe02;
                  }
                  else {
                    uVar9 = 0;
                    if (*(int *)((long)pvVar16 + 0xcc) == 3) {
                      uVar9 = 0xfffffe01;
                    }
                  }
                }
              }
              if (uVar9 == 0) {
                nghttp2_frame_pack_altsvc(bufs,&pnVar10->ext);
                goto LAB_0010b870;
              }
            }
          }
          if (uVar9 == 0xfffffdf2) {
            unaff_RBP = 0;
LAB_0010bdd8:
            cVar18 = '\x01';
          }
          else if (uVar9 == 0xfffffe04) {
            cVar18 = '\x04';
          }
          else if ((int)uVar9 < 0) {
            if (((pnVar10->hd).type != '\0') &&
               (p_Var6 = (session->callbacks).on_frame_not_send_callback,
               0xfffffc7c < uVar9 && p_Var6 != (nghttp2_on_frame_not_send_callback)0x0)) {
              bVar23 = true;
              if (((pnVar10->hd).type != '\b') &&
                 (iVar7 = (*p_Var6)(session,pnVar10,uVar9,session->user_data), iVar7 != 0)) {
                nghttp2_outbound_item_free((nghttp2_outbound_item *)&pnVar10->hd,mem);
                nghttp2_mem_free(mem,pnVar10);
                unaff_RBP = -0x386;
                bVar23 = false;
              }
              cVar18 = '\x01';
              if (!bVar23) goto LAB_0010c02e;
            }
            uVar20 = 2;
            if ((pnVar10->hd).type == '\x05') {
              stream_id = (pnVar10->push_promise).promised_stream_id;
            }
            else {
              stream_id = 0;
              if (((pnVar10->hd).type == '\x01') &&
                 (stream_id = 0, (pnVar10->headers).cat == NGHTTP2_HCAT_REQUEST)) {
                stream_id = (pnVar10->hd).stream_id;
                if (*(char *)((long)pnVar10 + 0x84) == '\0') {
                  uVar20 = 7;
                }
                else {
                  uVar20 = *(uint32_t *)(pnVar10 + 2);
                }
              }
            }
            if (stream_id == 0) {
              iVar7 = 0;
            }
            else {
              iVar7 = nghttp2_session_close_stream(session,stream_id,uVar20);
            }
            nghttp2_outbound_item_free((nghttp2_outbound_item *)&pnVar10->hd,mem);
            nghttp2_mem_free(mem,pnVar10);
            active_outbound_item_reset(aob,mem);
            if (iVar7 < -900) {
              unaff_RBP = (nghttp2_ssize)iVar7;
              goto LAB_0010bdd8;
            }
            if (uVar9 == 0xfffffdf5) {
              uVar9 = session_terminate_session(session,session->last_proc_stream_id,2,(char *)0x0);
            }
            cVar18 = (-0x385 < (int)uVar9) * '\x03' + '\x01';
            if ((int)uVar9 < -900) {
              unaff_RBP = (long)(int)uVar9;
            }
          }
          else {
            (session->aob).item = (nghttp2_outbound_item *)pnVar10;
            (session->aob).framebufs.cur = (session->aob).framebufs.head;
            if ((pnVar10->hd).type == '\0') {
              if (*(char *)((long)pnVar10 + 0x7a) == '\0') goto LAB_0010c01e;
              (session->aob).state = NGHTTP2_OB_SEND_NO_COPY;
            }
            else {
              p_Var5 = (session->callbacks).before_frame_send_callback;
              if (p_Var5 == (nghttp2_before_frame_send_callback)0x0) {
                iVar7 = 0;
              }
              else {
                iVar8 = (*p_Var5)(session,pnVar10,session->user_data);
                iVar7 = -0x386;
                if (iVar8 == 0) {
                  iVar7 = iVar8;
                }
                if (iVar8 == -0x217) {
                  iVar7 = iVar8;
                }
              }
              if (iVar7 < -900) {
                unaff_RBP = (nghttp2_ssize)iVar7;
LAB_0010bf6d:
                cVar18 = '\x01';
LAB_0010bf72:
                bVar23 = false;
              }
              else {
                if (iVar7 == -0x217) {
                  p_Var6 = (session->callbacks).on_frame_not_send_callback;
                  if ((p_Var6 != (nghttp2_on_frame_not_send_callback)0x0) &&
                     (iVar7 = (*p_Var6)(session,pnVar10,-0x217,session->user_data), iVar7 != 0)) {
                    unaff_RBP = -0x386;
                    goto LAB_0010bf6d;
                  }
                  uVar20 = 2;
                  if ((pnVar10->hd).type == '\x05') {
                    lVar15 = 0x28;
                    uVar20 = 2;
LAB_0010c196:
                    iVar7 = *(int *)((long)pnVar10 + lVar15);
                  }
                  else {
                    iVar7 = 0;
                    if (((pnVar10->hd).type == '\x01') &&
                       ((pnVar10->headers).cat == NGHTTP2_HCAT_REQUEST)) {
                      lVar15 = 8;
                      uVar20 = 7;
                      goto LAB_0010c196;
                    }
                  }
                  if (iVar7 != 0) {
                    iVar7 = nghttp2_session_close_stream(session,iVar7,uVar20);
                    if (iVar7 < -900) {
                      bVar23 = false;
                      cVar18 = '\x01';
                      unaff_RBP = (long)iVar7;
                      goto LAB_0010c01a;
                    }
                  }
                  active_outbound_item_reset(aob,mem);
                  cVar18 = '\x04';
                  goto LAB_0010bf72;
                }
                cVar18 = '\0';
                bVar23 = true;
              }
LAB_0010c01a:
              if (!bVar23) goto LAB_0010c02e;
LAB_0010c01e:
              (session->aob).state = NGHTTP2_OB_SEND_DATA;
            }
            cVar18 = '\x04';
          }
        }
LAB_0010c02e:
        if (cVar18 != '\x04') {
          return unaff_RBP;
        }
        goto LAB_0010b28d;
      case NGHTTP2_OB_SEND_DATA:
        pnVar3 = (session->aob).framebufs.cur;
        puVar21 = (pnVar3->buf).pos;
        if (puVar21 == (pnVar3->buf).last) {
          if ((fast_cb != 0) || (iVar7 = session_after_frame_sent1(session), -1 < iVar7)) {
            session_after_frame_sent2(session);
            bVar23 = true;
            break;
          }
          if (-0x385 < iVar7) {
            __assert_fail("nghttp2_is_fatal(rv)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                          ,0xd69,
                          "nghttp2_ssize nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                         );
          }
          unaff_RBP = (nghttp2_ssize)iVar7;
        }
        else {
          *data_ptr = puVar21;
          puVar21 = (pnVar3->buf).last;
          unaff_RBP = (long)puVar21 - (long)(pnVar3->buf).pos;
          (pnVar3->buf).pos = puVar21;
        }
        bVar23 = false;
        break;
      case NGHTTP2_OB_SEND_NO_COPY:
        pnVar2 = (session->aob).item;
        pnVar11 = (nghttp2_stream *)nghttp2_map_find(&session->streams,(pnVar2->frame).hd.stream_id)
        ;
        if ((pnVar11 == (nghttp2_stream *)0x0) || ((pnVar11->flags & 2) != 0)) {
          pnVar11 = (nghttp2_stream *)0x0;
        }
        else if (pnVar11->state == NGHTTP2_STREAM_IDLE) {
          pnVar11 = (nghttp2_stream *)0x0;
        }
        if (pnVar11 == (nghttp2_stream *)0x0) {
LAB_0010b464:
          active_outbound_item_reset(aob,mem);
          bVar23 = true;
        }
        else {
          pnVar10 = &((session->aob).item)->frame;
          iVar7 = (*(session->callbacks).send_data_callback)
                            (session,pnVar10,(((session->aob).framebufs.cur)->buf).pos,
                             (pnVar10->hd).length - (pnVar10->data).padlen,
                             (nghttp2_data_source *)((long)pnVar10 + 0x68),session->user_data);
          if (((0x16 < iVar7 + 0x20eU) || ((0x400021U >> (iVar7 + 0x20eU & 0x1f) & 1) == 0)) &&
             (iVar7 != 0)) {
            iVar7 = -0x386;
          }
          if (iVar7 < -900) {
LAB_0010b4c8:
            unaff_RBP = (nghttp2_ssize)iVar7;
            bVar23 = false;
          }
          else if (iVar7 == -0x1f8) {
            bVar23 = false;
            unaff_RBP = 0;
          }
          else {
            if (iVar7 == -0x209) {
              session_detach_stream_item(session,pnVar11);
              iVar7 = nghttp2_session_add_rst_stream(session,(pnVar2->frame).hd.stream_id,2);
              if (-0x385 < iVar7) goto LAB_0010b464;
              goto LAB_0010b4c8;
            }
            iVar8 = session_after_frame_sent1(session);
            if (iVar8 < 0) {
              if (-0x385 < iVar8) {
                __assert_fail("nghttp2_is_fatal(rv)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                              ,0xda8,
                              "nghttp2_ssize nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                             );
              }
              unaff_RBP = (nghttp2_ssize)iVar8;
              bVar23 = false;
            }
            else {
              session_after_frame_sent2(session);
              bVar23 = iVar7 != -0x20e;
              if (!bVar23) {
                unaff_RBP = 0;
              }
            }
          }
        }
        break;
      case NGHTTP2_OB_SEND_CLIENT_MAGIC:
        pnVar3 = (session->aob).framebufs.cur;
        puVar21 = (pnVar3->buf).pos;
        if (puVar21 != (pnVar3->buf).last) {
          *data_ptr = puVar21;
          puVar21 = (pnVar3->buf).last;
          puVar4 = (pnVar3->buf).pos;
          (pnVar3->buf).pos = puVar21;
          return (long)puVar21 - (long)puVar4;
        }
        active_outbound_item_reset(aob,mem);
        goto LAB_0010b28d;
      default:
        goto code_r0x0010b29b;
      }
    } while (bVar23);
  }
  return unaff_RBP;
}

Assistant:

static nghttp2_ssize nghttp2_session_mem_send_internal(nghttp2_session *session,
                                                       const uint8_t **data_ptr,
                                                       int fast_cb) {
  int rv;
  nghttp2_active_outbound_item *aob;
  nghttp2_bufs *framebufs;
  nghttp2_mem *mem;

  mem = &session->mem;
  aob = &session->aob;
  framebufs = &aob->framebufs;

  /* We may have idle streams more than we expect (e.g.,
     nghttp2_session_change_stream_priority() or
     nghttp2_session_create_idle_stream()).  Adjust them here. */
  rv = nghttp2_session_adjust_idle_stream(session);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  for (;;) {
    switch (aob->state) {
    case NGHTTP2_OB_POP_ITEM: {
      nghttp2_outbound_item *item;

      item = nghttp2_session_pop_next_ob_item(session);
      if (item == NULL) {
        return 0;
      }

      rv = session_prep_frame(session, item);
      if (rv == NGHTTP2_ERR_PAUSE) {
        return 0;
      }
      if (rv == NGHTTP2_ERR_DEFERRED) {
        DEBUGF("send: frame transmission deferred\n");
        break;
      }
      if (rv < 0) {
        int32_t opened_stream_id = 0;
        uint32_t error_code = NGHTTP2_INTERNAL_ERROR;
        int rv2 = 0;

        DEBUGF("send: frame preparation failed with %s\n",
               nghttp2_strerror(rv));
        /* TODO If the error comes from compressor, the connection
           must be closed. */
        if (item->frame.hd.type != NGHTTP2_DATA &&
            session->callbacks.on_frame_not_send_callback && is_non_fatal(rv)) {
          nghttp2_frame *frame = &item->frame;
          /* The library is responsible for the transmission of
             WINDOW_UPDATE frame, so we don't call error callback for
             it. */
          if (frame->hd.type != NGHTTP2_WINDOW_UPDATE &&
              session->callbacks.on_frame_not_send_callback(
                session, frame, rv, session->user_data) != 0) {
            nghttp2_outbound_item_free(item, mem);
            nghttp2_mem_free(mem, item);

            return NGHTTP2_ERR_CALLBACK_FAILURE;
          }
        }
        /* We have to close stream opened by failed request HEADERS
           or PUSH_PROMISE. */
        switch (item->frame.hd.type) {
        case NGHTTP2_HEADERS:
          if (item->frame.headers.cat == NGHTTP2_HCAT_REQUEST) {
            opened_stream_id = item->frame.hd.stream_id;
            if (item->aux_data.headers.canceled) {
              error_code = item->aux_data.headers.error_code;
            } else {
              /* Set error_code to REFUSED_STREAM so that application
                 can send request again. */
              error_code = NGHTTP2_REFUSED_STREAM;
            }
          }
          break;
        case NGHTTP2_PUSH_PROMISE:
          opened_stream_id = item->frame.push_promise.promised_stream_id;
          break;
        }
        if (opened_stream_id) {
          /* careful not to override rv */
          rv2 =
            nghttp2_session_close_stream(session, opened_stream_id, error_code);
        }

        nghttp2_outbound_item_free(item, mem);
        nghttp2_mem_free(mem, item);
        active_outbound_item_reset(aob, mem);

        if (nghttp2_is_fatal(rv2)) {
          return rv2;
        }

        if (rv == NGHTTP2_ERR_HEADER_COMP) {
          /* If header compression error occurred, should terminate
             connection. */
          rv =
            nghttp2_session_terminate_session(session, NGHTTP2_INTERNAL_ERROR);
        }
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
        break;
      }

      aob->item = item;

      nghttp2_bufs_rewind(framebufs);

      if (item->frame.hd.type != NGHTTP2_DATA) {
        nghttp2_frame *frame;

        frame = &item->frame;

        DEBUGF("send: next frame: payloadlen=%zu, type=%u, flags=0x%02x, "
               "stream_id=%d\n",
               frame->hd.length, frame->hd.type, frame->hd.flags,
               frame->hd.stream_id);

        rv = session_call_before_frame_send(session, frame);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }

        if (rv == NGHTTP2_ERR_CANCEL) {
          int32_t opened_stream_id = 0;
          uint32_t error_code = NGHTTP2_INTERNAL_ERROR;

          if (session->callbacks.on_frame_not_send_callback) {
            if (session->callbacks.on_frame_not_send_callback(
                  session, frame, rv, session->user_data) != 0) {
              return NGHTTP2_ERR_CALLBACK_FAILURE;
            }
          }

          /* We have to close stream opened by canceled request
             HEADERS or PUSH_PROMISE. */
          switch (item->frame.hd.type) {
          case NGHTTP2_HEADERS:
            if (item->frame.headers.cat == NGHTTP2_HCAT_REQUEST) {
              opened_stream_id = item->frame.hd.stream_id;
              /* We don't have to check
                 item->aux_data.headers.canceled since it has already
                 been checked. */
              /* Set error_code to REFUSED_STREAM so that application
                 can send request again. */
              error_code = NGHTTP2_REFUSED_STREAM;
            }
            break;
          case NGHTTP2_PUSH_PROMISE:
            opened_stream_id = item->frame.push_promise.promised_stream_id;
            break;
          }
          if (opened_stream_id) {
            /* careful not to override rv */
            int rv2;
            rv2 = nghttp2_session_close_stream(session, opened_stream_id,
                                               error_code);

            if (nghttp2_is_fatal(rv2)) {
              return rv2;
            }
          }

          active_outbound_item_reset(aob, mem);

          break;
        }
      } else {
        DEBUGF("send: next frame: DATA\n");

        if (item->aux_data.data.no_copy) {
          aob->state = NGHTTP2_OB_SEND_NO_COPY;
          break;
        }
      }

      DEBUGF("send: start transmitting frame type=%u, length=%td\n",
             framebufs->cur->buf.pos[3],
             framebufs->cur->buf.last - framebufs->cur->buf.pos);

      aob->state = NGHTTP2_OB_SEND_DATA;

      break;
    }
    case NGHTTP2_OB_SEND_DATA: {
      size_t datalen;
      nghttp2_buf *buf;

      buf = &framebufs->cur->buf;

      if (buf->pos == buf->last) {
        DEBUGF("send: end transmission of a frame\n");

        /* Frame has completely sent */
        if (fast_cb) {
          session_after_frame_sent2(session);
        } else {
          rv = session_after_frame_sent1(session);
          if (rv < 0) {
            /* FATAL */
            assert(nghttp2_is_fatal(rv));
            return rv;
          }
          session_after_frame_sent2(session);
        }
        /* We have already adjusted the next state */
        break;
      }

      *data_ptr = buf->pos;
      datalen = nghttp2_buf_len(buf);

      /* We increment the offset here. If send_callback does not send
         everything, we will adjust it. */
      buf->pos += datalen;

      return (nghttp2_ssize)datalen;
    }
    case NGHTTP2_OB_SEND_NO_COPY: {
      nghttp2_stream *stream;
      nghttp2_frame *frame;
      int pause;

      DEBUGF("send: no copy DATA\n");

      frame = &aob->item->frame;

      stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
      if (stream == NULL) {
        DEBUGF("send: no copy DATA cancelled because stream was closed\n");

        active_outbound_item_reset(aob, mem);

        break;
      }

      rv = session_call_send_data(session, aob->item, framebufs);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }

      if (rv == NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE) {
        session_detach_stream_item(session, stream);

        rv = nghttp2_session_add_rst_stream(session, frame->hd.stream_id,
                                            NGHTTP2_INTERNAL_ERROR);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }

        active_outbound_item_reset(aob, mem);

        break;
      }

      if (rv == NGHTTP2_ERR_WOULDBLOCK) {
        return 0;
      }

      pause = (rv == NGHTTP2_ERR_PAUSE);

      rv = session_after_frame_sent1(session);
      if (rv < 0) {
        assert(nghttp2_is_fatal(rv));
        return rv;
      }
      session_after_frame_sent2(session);

      /* We have already adjusted the next state */

      if (pause) {
        return 0;
      }

      break;
    }
    case NGHTTP2_OB_SEND_CLIENT_MAGIC: {
      size_t datalen;
      nghttp2_buf *buf;

      buf = &framebufs->cur->buf;

      if (buf->pos == buf->last) {
        DEBUGF("send: end transmission of client magic\n");
        active_outbound_item_reset(aob, mem);
        break;
      }

      *data_ptr = buf->pos;
      datalen = nghttp2_buf_len(buf);

      buf->pos += datalen;

      return (nghttp2_ssize)datalen;
    }
    }
  }
}